

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppPrinter.cpp
# Opt level: O0

void __thiscall hdc::CppPrinter::visit(CppPrinter *this,LiteralSymbolExpression *expression)

{
  ostream *poVar1;
  string *psVar2;
  Token local_48;
  LiteralExpression *local_18;
  LiteralSymbolExpression *expression_local;
  CppPrinter *this_local;
  
  this->isExpression = true;
  local_18 = &expression->super_LiteralExpression;
  expression_local = (LiteralSymbolExpression *)this;
  poVar1 = std::operator<<((ostream *)&this->field_0x20,'\"');
  LiteralExpression::get_token(&local_48,local_18);
  psVar2 = Token::getLexem_abi_cxx11_(&local_48);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  std::operator<<(poVar1,'\"');
  Token::~Token(&local_48);
  return;
}

Assistant:

void CppPrinter::visit(LiteralSymbolExpression* expression) {
    isExpression = true;
    output << '"' << expression->get_token().getLexem() << '"';
}